

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void CompressTables(lemon *lemp)

{
  state *psVar1;
  rule *prVar2;
  state *psVar3;
  bool bVar4;
  symbol *psVar5;
  action *paVar6;
  ulong uVar7;
  action **ppaVar8;
  action **ppaVar9;
  int iVar10;
  int iVar11;
  action *paVar12;
  rule *prVar13;
  long lVar14;
  
  lVar14 = 0;
  do {
    uVar7 = (ulong)lemp->nstate;
    if ((long)uVar7 <= lVar14) {
      for (lVar14 = 0; lVar14 < (int)uVar7; lVar14 = lVar14 + 1) {
        ppaVar9 = &lemp->sorted[lVar14]->ap;
        while (paVar6 = *ppaVar9, paVar6 != (action *)0x0) {
          if (((paVar6->type == SHIFT) && (((paVar6->x).stp)->autoReduce != 0)) &&
             (prVar13 = ((paVar6->x).stp)->pDfltReduce, prVar13 != (rule *)0x0)) {
            paVar6->type = SHIFTREDUCE;
            (paVar6->x).stp = (state *)prVar13;
          }
          ppaVar9 = &paVar6->next;
        }
        uVar7 = (ulong)(uint)lemp->nstate;
      }
      lVar14 = 0;
      do {
        if ((int)uVar7 <= lVar14) {
          return;
        }
        psVar1 = lemp->sorted[lVar14];
        paVar6 = psVar1->ap;
        while (paVar12 = paVar6, paVar12 != (action *)0x0) {
          paVar6 = paVar12->next;
          if (((paVar12->type == SHIFTREDUCE) &&
              (psVar3 = (paVar12->x).stp, *(int *)&psVar3[1].cfp != 0)) &&
             ((*(int *)&psVar3->ap == 1 &&
              (ppaVar9 = &psVar1->ap, lemp->nterminal <= paVar12->sp->index)))) {
            while( true ) {
              paVar6 = *ppaVar9;
              if (paVar6 == (action *)0x0) {
                __assert_fail("ap2!=0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                              ,0x122c,"void CompressTables(struct lemon *)");
              }
              if ((paVar6 != paVar12) && (paVar6->sp == (symbol *)psVar3->bp)) break;
              ppaVar9 = &paVar6->next;
            }
            paVar12->spOpt = paVar6->sp;
            paVar12->type = paVar6->type;
            paVar12->x = paVar6->x;
            paVar6 = paVar12;
          }
        }
        lVar14 = lVar14 + 1;
        uVar7 = (ulong)(uint)lemp->nstate;
      } while( true );
    }
    psVar1 = lemp->sorted[lVar14];
    prVar13 = (rule *)0x0;
    iVar10 = 0;
    bVar4 = false;
    ppaVar9 = &psVar1->ap;
    ppaVar8 = ppaVar9;
    while (paVar6 = *ppaVar8, paVar6 != (action *)0x0) {
      if (paVar6->type == REDUCE) {
        prVar2 = (rule *)(paVar6->x).stp;
        if ((prVar2->lhsStart == 0) && (prVar2 != prVar13)) {
          iVar11 = 1;
          paVar12 = paVar6;
          while (paVar12 = paVar12->next, paVar12 != (action *)0x0) {
            if (paVar12->type == REDUCE) {
              iVar11 = iVar11 + (uint)((rule *)(paVar12->x).stp == prVar2 &&
                                      (rule *)(paVar12->x).stp != prVar13);
            }
          }
          if (iVar10 < iVar11) {
            prVar13 = prVar2;
            iVar10 = iVar11;
          }
        }
      }
      else if ((paVar6->type == SHIFT) && (paVar6->sp == lemp->wildcard)) {
        bVar4 = true;
      }
      ppaVar8 = &paVar6->next;
    }
    if ((0 < iVar10) && (ppaVar8 = ppaVar9, !bVar4)) {
      while( true ) {
        paVar6 = *ppaVar8;
        if (paVar6 == (action *)0x0) {
          __assert_fail("ap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                        ,0x11f3,"void CompressTables(struct lemon *)");
        }
        if ((paVar6->type == REDUCE) && ((rule *)(paVar6->x).stp == prVar13)) break;
        ppaVar8 = &paVar6->next;
      }
      psVar5 = Symbol_new("{default}");
      paVar6->sp = psVar5;
      while (paVar6 = paVar6->next, paVar6 != (action *)0x0) {
        if ((paVar6->type == REDUCE) && ((rule *)(paVar6->x).stp == prVar13)) {
          paVar6->type = NOT_USED;
        }
      }
      paVar6 = Action_sort(*ppaVar9);
      *ppaVar9 = paVar6;
      for (; paVar6 != (action *)0x0; paVar6 = paVar6->next) {
        if (paVar6->type == REDUCE) {
          if ((rule *)(paVar6->x).stp != prVar13) goto LAB_001079f1;
        }
        else if (paVar6->type == SHIFT) goto LAB_001079f1;
      }
      psVar1->autoReduce = 1;
      psVar1->pDfltReduce = prVar13;
    }
LAB_001079f1:
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2, *nextap;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }

    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possbile
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT ) break;
      if( ap->type==REDUCE && ap->x.rp!=rbest ) break;
    }
    if( ap==0 ){
      stp->autoReduce = 1;
      stp->pDfltReduce = rbest;
    }
  }

  /* Make a second pass over all states and actions.  Convert
  ** every action that is a SHIFT to an autoReduce state into
  ** a SHIFTREDUCE action.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=ap->next){
      struct state *pNextState;
      if( ap->type!=SHIFT ) continue;
      pNextState = ap->x.stp;
      if( pNextState->autoReduce && pNextState->pDfltReduce!=0 ){
        ap->type = SHIFTREDUCE;
        ap->x.rp = pNextState->pDfltReduce;
      }
    }
  }

  /* If a SHIFTREDUCE action specifies a rule that has a single RHS term
  ** (meaning that the SHIFTREDUCE will land back in the state where it
  ** started) and if there is no C-code associated with the reduce action,
  ** then we can go ahead and convert the action to be the same as the
  ** action for the RHS of the rule.
  */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(ap=stp->ap; ap; ap=nextap){
      nextap = ap->next;
      if( ap->type!=SHIFTREDUCE ) continue;
      rp = ap->x.rp;
      if( rp->noCode==0 ) continue;
      if( rp->nrhs!=1 ) continue;
#if 1
      /* Only apply this optimization to non-terminals.  It would be OK to
      ** apply it to terminal symbols too, but that makes the parser tables
      ** larger. */
      if( ap->sp->index<lemp->nterminal ) continue;
#endif
      /* If we reach this point, it means the optimization can be applied */
      nextap = ap;
      for(ap2=stp->ap; ap2 && (ap2==ap || ap2->sp!=rp->lhs); ap2=ap2->next){}
      assert( ap2!=0 );
      ap->spOpt = ap2->sp;
      ap->type = ap2->type;
      ap->x = ap2->x;
    }
  }
}